

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxToken.cpp
# Opt level: O2

string * __thiscall
psy::C::to_string_abi_cxx11_(string *__return_storage_ptr__,C *this,Category category)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "[keywords]";
    __a = &local_9;
    break;
  case 1:
    __s = "[identifiers]";
    __a = &local_a;
    break;
  case 2:
    __s = "[constants]";
    __a = &local_b;
    break;
  case 3:
    __s = "[string literals]";
    __a = &local_c;
    break;
  case 4:
    __s = "[punctuators]";
    __a = &local_d;
    break;
  default:
    __s = "[unrecognized]";
    __a = &local_e;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(SyntaxToken::Category category)
{
    switch (category) {
        case SyntaxToken::Category::Keywords:
            return "[keywords]";

        case SyntaxToken::Category::Identifiers:
            return "[identifiers]";

        case SyntaxToken::Category::Constants:
            return "[constants]";

        case SyntaxToken::Category::StringLiterals:
            return "[string literals]";

        case SyntaxToken::Category::Punctuators:
            return "[punctuators]";

        default:
            return "[unrecognized]";
    }
}